

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReach.c
# Opt level: O1

void Abc_NtkVerifyUsingBdds
               (Abc_Ntk_t *pNtk,int nBddMax,int nIterMax,int fPartition,int fReorder,int fVerbose)

{
  long *plVar1;
  int *piVar2;
  DdNode *n;
  int iVar3;
  uint uVar4;
  uint uVar5;
  DdManager *dd;
  void *pvVar6;
  undefined8 uVar7;
  DdNode **pbParts;
  DdNode *n_00;
  DdNode *n_01;
  int fVerbose_00;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  timespec ts;
  int in_stack_ffffffffffffff88;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReach.c"
                  ,0x10d,"void Abc_NtkVerifyUsingBdds(Abc_Ntk_t *, int, int, int, int, int)");
  }
  if (pNtk->vPos->nSize != 1) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReach.c"
                  ,0x10e,"void Abc_NtkVerifyUsingBdds(Abc_Ntk_t *, int, int, int, int, int)");
  }
  if (*(int *)((long)*pNtk->vPos->pArray + 0x2c) == 0) {
    dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,nBddMax,1,fReorder,fVerbose);
    if (dd == (DdManager *)0x0) {
      printf("The number of intermediate BDD nodes exceeded the limit (%d).\n",nBddMax);
      return;
    }
    if (fVerbose != 0) {
      uVar4 = Cudd_ReadKeys(dd);
      uVar5 = Cudd_ReadDead(dd);
      printf("Shared BDD size is %6d nodes.\n",(ulong)(uVar4 - uVar5));
    }
    if (0 < pNtk->vPos->nSize) {
      plVar1 = (long *)*pNtk->vPos->pArray;
      lVar9 = *(long *)(*plVar1 + 0x1b0);
      if (7 < *(int *)(lVar9 + 4)) {
        piVar2 = *(int **)(*(long *)(lVar9 + 8) + 0x38);
        if (*(void **)(piVar2 + 2) != (void *)0x0) {
          iVar3 = (int)plVar1[2];
          lVar9 = (long)iVar3;
          iVar10 = *piVar2;
          if (iVar10 <= iVar3) {
            iVar11 = iVar3 + 10;
            if (iVar3 < iVar10 * 2) {
              iVar11 = iVar10 * 2;
            }
            if (iVar10 < iVar11) {
              pvVar6 = realloc(*(void **)(piVar2 + 2),(long)iVar11 * 8);
              *(void **)(piVar2 + 2) = pvVar6;
              memset((void *)((long)pvVar6 + (long)*piVar2 * 8),0,((long)iVar11 - (long)*piVar2) * 8
                    );
              *piVar2 = iVar11;
            }
          }
          if ((*(long *)(*(long *)(piVar2 + 2) + lVar9 * 8) == 0) &&
             (*(code **)(piVar2 + 8) != (code *)0x0)) {
            uVar7 = (**(code **)(piVar2 + 8))(*(undefined8 *)(piVar2 + 4));
            *(undefined8 *)(*(long *)(piVar2 + 2) + lVar9 * 8) = uVar7;
          }
          n = *(DdNode **)(*(long *)(piVar2 + 2) + lVar9 * 8);
          Cudd_Ref(n);
          pbParts = Abc_NtkCreatePartitions(dd,pNtk,fReorder,fVerbose);
          n_00 = Abc_NtkInitStateVarMap(dd,pNtk,fVerbose_00);
          Cudd_Ref(n_00);
          iVar3 = Cudd_bddLeq(dd,n_00,(DdNode *)((ulong)n ^ 1));
          if (iVar3 == 0) {
            printf("The miter is proved REACHABLE in the initial state.  ");
          }
          else {
            n_01 = Abc_NtkComputeReachable
                             (dd,pNtk,pbParts,n_00,n,nBddMax,nIterMax,fPartition,
                              in_stack_ffffffffffffff88,fVerbose);
            if (n_01 != (DdNode *)0x0) {
              Cudd_Ref(n_01);
              Cudd_RecursiveDeref(dd,n_01);
            }
          }
          Cudd_RecursiveDeref(dd,n);
          Cudd_RecursiveDeref(dd,n_00);
          if (0 < pNtk->nObjCounts[8]) {
            lVar9 = 0;
            do {
              Cudd_RecursiveDeref(dd,pbParts[lVar9]);
              lVar9 = lVar9 + 1;
            } while (lVar9 < pNtk->nObjCounts[8]);
          }
          if (pbParts != (DdNode **)0x0) {
            free(pbParts);
          }
          Extra_StopManager(dd);
          Abc_Print((int)dd,"%s =","Time");
          iVar10 = 3;
          iVar3 = clock_gettime(3,&local_40);
          if (iVar3 < 0) {
            lVar9 = -1;
          }
          else {
            lVar9 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
          }
          Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar9 + lVar8) / 1000000.0);
          fflush(_stdout);
          return;
        }
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecAtt.h"
                      ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  __assert_fail("Abc_ObjFanoutNum(Abc_NtkPo(pNtk,0)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReach.c"
                ,0x10f,"void Abc_NtkVerifyUsingBdds(Abc_Ntk_t *, int, int, int, int, int)");
}

Assistant:

void Abc_NtkVerifyUsingBdds( Abc_Ntk_t * pNtk, int nBddMax, int nIterMax, int fPartition, int fReorder, int fVerbose )
{
    DdManager * dd;
    DdNode ** pbParts;
    DdNode * bOutput, * bReached, * bInitial;
    int i;
    abctime clk = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
    assert( Abc_ObjFanoutNum(Abc_NtkPo(pNtk,0)) == 0 ); // PO should go first

    // compute the global BDDs of the latches
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, nBddMax, 1, fReorder, fVerbose );    
    if ( dd == NULL )
    {
        printf( "The number of intermediate BDD nodes exceeded the limit (%d).\n", nBddMax );
        return;
    }
    if ( fVerbose )
        printf( "Shared BDD size is %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // save the output BDD
    bOutput = (DdNode *)Abc_ObjGlobalBdd(Abc_NtkPo(pNtk,0)); Cudd_Ref( bOutput );

    // create partitions
    pbParts = Abc_NtkCreatePartitions( dd, pNtk, fReorder, fVerbose );

    // create the initial state and the variable map
    bInitial  = Abc_NtkInitStateVarMap( dd, pNtk, fVerbose );  Cudd_Ref( bInitial );

    // check the result
    if ( !Cudd_bddLeq( dd, bInitial, Cudd_Not(bOutput) ) )
        printf( "The miter is proved REACHABLE in the initial state.  " );
    else
    {
        // compute the reachable states
        bReached = Abc_NtkComputeReachable( dd, pNtk, pbParts, bInitial, bOutput, nBddMax, nIterMax, fPartition, fReorder, fVerbose ); 
        if ( bReached != NULL )
        {
            Cudd_Ref( bReached );
            Cudd_RecursiveDeref( dd, bReached );
        }
    }

    // cleanup
    Cudd_RecursiveDeref( dd, bOutput );
    Cudd_RecursiveDeref( dd, bInitial );
    for ( i = 0; i < Abc_NtkLatchNum(pNtk); i++ )
        Cudd_RecursiveDeref( dd, pbParts[i] );
    ABC_FREE( pbParts );
    Extra_StopManager( dd );

    // report the runtime
    ABC_PRT( "Time", Abc_Clock() - clk );
    fflush( stdout );
}